

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::outputStyleAscii(Binasc *this,ostream *out,istream *input)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uchar outputWord [256];
  
  iVar2 = 0;
  memset(outputWord,0,0x100);
  bVar4 = std::istream::get();
  bVar1 = false;
  iVar8 = 0;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      if (iVar8 != 0) {
        std::endl<char,std::char_traits<char>>(out);
      }
      return 1;
    }
    iVar5 = isprint((uint)bVar4);
    bVar3 = false;
    if (iVar5 != 0) {
      iVar5 = isspace((uint)bVar4);
      if (bVar1 || iVar5 != 0) {
        iVar7 = iVar8;
        if (iVar5 != 0) goto LAB_0012735d;
      }
      else {
        iVar7 = this->m_maxLineLength;
        outputWord[iVar8] = '\0';
        if (iVar8 + iVar2 < iVar7) {
          iVar9 = 0;
          if (iVar2 != 0) {
            std::operator<<(out,' ');
            iVar9 = iVar2 + 1;
          }
          std::operator<<(out,(char *)outputWord);
          iVar7 = 0;
          iVar2 = iVar9 + iVar8;
        }
        else {
          poVar6 = std::operator<<(out,'\n');
          std::operator<<(poVar6,(char *)outputWord);
          iVar7 = 0;
          iVar2 = iVar8;
        }
      }
      iVar8 = iVar7 + 1;
      outputWord[iVar7] = bVar4;
      bVar3 = iVar5 == 0;
    }
LAB_0012735d:
    bVar1 = bVar3;
    bVar4 = std::istream::get();
  } while( true );
}

Assistant:

int Binasc::outputStyleAscii(std::ostream& out, std::istream& input) {
	uchar outputWord[256] = {0};   // storage for current word
	int index     = 0;             // current length of word
	int lineCount = 0;             // current length of line
	int type      = 0;             // 0=space, 1=printable
	uchar ch;                      // current input byte

	ch = static_cast<uchar>(input.get());
	while (!input.eof()) {
		int lastType = type;
		type = (isprint(ch) && !isspace(ch)) ? 1 : 0;

		if ((type == 1) && (lastType == 0)) {
			// start of a new word.  check where to put old word
			if (index + lineCount >= m_maxLineLength) {  // put on next line
				outputWord[index] = '\0';
				out << '\n' << outputWord;
				lineCount = index;
				index = 0;
			} else {                                   // put on current line
				outputWord[index] = '\0';
				if (lineCount != 0) {
					out << ' ';
					lineCount++;
				}
				out << outputWord;
				lineCount += index;
				index = 0;
			}
		}
		if (type == 1) {
			outputWord[index++] = ch;
		}
		ch = static_cast<uchar>(input.get());
	}

	if (index != 0) {
		out << std::endl;
	}

	return 1;
}